

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O0

ssize_t tnt_buf_read(tnt_stream *s,char *buf,size_t size)

{
  long *plVar1;
  size_t avail;
  tnt_stream_buf *sb;
  size_t size_local;
  char *buf_local;
  tnt_stream *s_local;
  
  plVar1 = (long *)s->data;
  if (*plVar1 == 0) {
    s_local = (tnt_stream *)0x0;
  }
  else if (plVar1[1] == plVar1[3]) {
    s_local = (tnt_stream *)0x0;
  }
  else {
    sb = (tnt_stream_buf *)size;
    if ((tnt_stream_buf *)(plVar1[1] - plVar1[3]) < size) {
      sb = (tnt_stream_buf *)(plVar1[1] - plVar1[3]);
    }
    memcpy((void *)(*plVar1 + plVar1[3]),buf,(size_t)sb);
    plVar1[3] = (long)&sb->data + plVar1[3];
    s_local = (tnt_stream *)sb;
  }
  return (ssize_t)s_local;
}

Assistant:

static ssize_t
tnt_buf_read(struct tnt_stream *s, char *buf, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->data == NULL)
		return 0;
	if (sb->size == sb->rdoff)
		return 0;
	size_t avail = sb->size - sb->rdoff;
	if (size > avail)
		size = avail;
	memcpy(sb->data + sb->rdoff, buf, size);
	sb->rdoff += size;
	return size;
}